

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O3

TestCaseGroup * vkt::SpirVAssembly::createOpQuantizeTests(TestContext *testCtx)

{
  TestCaseGroup *this;
  
  this = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(this,testCtx,"opquantize","Test OpQuantizeToF16");
  createOpQuantizeSingleOptionTests(this);
  createOpQuantizeTwoPossibilityTests(this);
  return this;
}

Assistant:

tcu::TestCaseGroup* createOpQuantizeTests(tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> opQuantizeTests (new tcu::TestCaseGroup(testCtx, "opquantize", "Test OpQuantizeToF16"));
	createOpQuantizeSingleOptionTests(opQuantizeTests.get());
	createOpQuantizeTwoPossibilityTests(opQuantizeTests.get());
	return opQuantizeTests.release();
}